

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O1

string * __thiscall
glcts::(anonymous_namespace)::LoadStoreMachine::GenLoadShader<tcu::Vector<int,4>>
          (string *__return_storage_ptr__,LoadStoreMachine *this,int stage,GLenum internalformat,
          Vector<int,_4> *expected_value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ostream *poVar3;
  undefined4 in_register_0000000c;
  GLenum e;
  GLenum e_00;
  GLenum e_01;
  GLenum e_02;
  long lVar4;
  int iVar5;
  char *pcVar6;
  ostringstream os;
  string local_2b0;
  char *local_290;
  undefined8 local_288;
  undefined2 local_280;
  undefined6 uStack_27e;
  string local_270;
  Vector<int,_4> *local_250;
  string local_248;
  string local_228;
  char *local_208;
  undefined8 local_200;
  undefined2 local_1f8;
  undefined6 uStack_1f6;
  char *local_1e8;
  undefined8 local_1e0;
  undefined2 local_1d8;
  undefined6 uStack_1d6;
  char *local_1c8;
  undefined8 local_1c0;
  undefined2 local_1b8;
  undefined6 uStack_1b6;
  undefined1 local_1a8 [376];
  
  local_250 = (Vector<int,_4> *)CONCAT44(in_register_0000000c,internalformat);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\n#define KSIZE 100",0x12);
  iVar5 = (int)this;
  if (iVar5 == 4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\nlayout(local_size_x = KSIZE) in;",0x21);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\nlayout(",8);
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_2b0,(ShaderImageLoadStoreBase *)(ulong)(uint)stage,e);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", binding = 3) readonly uniform ",0x20)
  ;
  local_290 = (char *)&local_280;
  local_280 = 0x69;
  local_288 = 1;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_290,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"image2D g_image_2d;\nlayout(",0x1b);
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_270,(ShaderImageLoadStoreBase *)(ulong)(uint)stage,e_00);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_270._M_dataplus._M_p,local_270._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", binding = 2) readonly uniform ",0x20)
  ;
  local_1b8 = 0x69;
  local_1c0 = 1;
  local_1c8 = (char *)&local_1b8;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_1b8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"image3D g_image_3d;\nlayout(",0x1b);
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_228,(ShaderImageLoadStoreBase *)(ulong)(uint)stage,e_01);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_228._M_dataplus._M_p,local_228._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", binding = 1) readonly uniform ",0x20)
  ;
  local_1d8 = 0x69;
  local_1e0 = 1;
  local_1e8 = (char *)&local_1d8;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_1d8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"imageCube g_image_cube;\nlayout(",0x1f)
  ;
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_248,(ShaderImageLoadStoreBase *)(ulong)(uint)stage,e_02);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_248._M_dataplus._M_p,local_248._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", binding = 0) readonly uniform ",0x20)
  ;
  local_1f8 = 0x69;
  local_200 = 1;
  local_208 = (char *)&local_1f8;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_1f8,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "image2DArray g_image_2darray;\nlayout(std430) buffer out_data {\n  ivec4 o_color[KSIZE];\n};\nvoid main() {"
             ,0x67);
  if (local_208 != (char *)&local_1f8) {
    operator_delete(local_208,CONCAT62(uStack_1f6,local_1f8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if (local_1e8 != (char *)&local_1d8) {
    operator_delete(local_1e8,CONCAT62(uStack_1d6,local_1d8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if (local_1c8 != (char *)&local_1b8) {
    operator_delete(local_1c8,CONCAT62(uStack_1b6,local_1b8) + 1);
  }
  paVar1 = &local_270.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != paVar1) {
    operator_delete(local_270._M_dataplus._M_p,
                    CONCAT62(local_270.field_2._M_allocated_capacity._2_6_,
                             local_270.field_2._M_allocated_capacity._0_2_) + 1);
  }
  if (local_290 != (char *)&local_280) {
    operator_delete(local_290,CONCAT62(uStack_27e,local_280) + 1);
  }
  paVar2 = &local_2b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_2b0._M_dataplus._M_p,
                    CONCAT62(local_2b0.field_2._M_allocated_capacity._2_6_,
                             local_2b0.field_2._M_allocated_capacity._0_2_) + 1);
  }
  if (iVar5 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n  ",3);
    local_2b0.field_2._M_allocated_capacity._0_2_ = 0x69;
    local_2b0._M_string_length = 1;
    local_2b0._M_dataplus._M_p = (pointer)paVar2;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,paVar2->_M_local_buf,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"vec4 g_value = ",0xf);
    local_280 = 0x69;
    local_288 = 1;
    local_290 = (char *)&local_280;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_280,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"vec4(o_color[gl_VertexID]) + ",0x1d);
    local_270.field_2._M_allocated_capacity._0_2_ = 0x69;
    local_270._M_string_length = 1;
    local_270._M_dataplus._M_p = (pointer)paVar1;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,paVar1->_M_local_buf,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"vec4",4);
    poVar3 = tcu::operator<<(poVar3,local_250);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,";",1);
  }
  else {
    if (iVar5 != 4) goto LAB_00c75ddf;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n  ",3);
    local_2b0.field_2._M_allocated_capacity._0_2_ = 0x69;
    local_2b0._M_string_length = 1;
    local_2b0._M_dataplus._M_p = (pointer)paVar2;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,paVar2->_M_local_buf,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"vec4 g_value = ",0xf);
    local_280 = 0x69;
    local_288 = 1;
    local_290 = (char *)&local_280;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_280,1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"vec4(o_color[gl_GlobalInvocationID.x]) + ",0x29);
    local_270.field_2._M_allocated_capacity._0_2_ = 0x69;
    local_270._M_string_length = 1;
    local_270._M_dataplus._M_p = (pointer)paVar1;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,paVar1->_M_local_buf,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"vec4",4);
    poVar3 = tcu::operator<<(poVar3,local_250);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,";",1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != paVar1) {
    operator_delete(local_270._M_dataplus._M_p,
                    CONCAT62(local_270.field_2._M_allocated_capacity._2_6_,
                             local_270.field_2._M_allocated_capacity._0_2_) + 1);
  }
  if (local_290 != (char *)&local_280) {
    operator_delete(local_290,CONCAT62(uStack_27e,local_280) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_2b0._M_dataplus._M_p,
                    CONCAT62(local_2b0.field_2._M_allocated_capacity._2_6_,
                             local_2b0.field_2._M_allocated_capacity._0_2_) + 1);
  }
LAB_00c75ddf:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "\n  int g_index[6] = int[](o_color[0].x, o_color[0].y, o_color[0].z, o_color[0].w, o_color[1].r, o_color[1].g);"
             ,0x6e);
  if (((ulong)this & 0xfffffffb) == 0) {
    lVar4 = 0x3c;
    if (iVar5 == 0) {
      lVar4 = 0x30;
    }
    pcVar6 = "\n  ivec2 coord = ivec2(gl_GlobalInvocationID.x, g_index[0]);";
    if (iVar5 == 0) {
      pcVar6 = "\n  ivec2 coord = ivec2(gl_VertexID, g_index[0]);";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,lVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\n  vec4 r = vec4(0.0, 1.0, 0.0, 1.0);\n  ",0x28);
  local_2b0.field_2._M_allocated_capacity._0_2_ = 0x69;
  local_2b0._M_string_length = 1;
  local_2b0._M_dataplus._M_p = (pointer)paVar2;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,paVar2->_M_local_buf,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "vec4 v;\n  v = imageLoad(g_image_2d, coord);\n  if (v != g_value) r = vec4(1.0, 0.0, float(coord.x), 2.0);\n  v = imageLoad(g_image_3d, ivec3(coord, g_index[0]));\n  if (v != g_value) r = vec4(1.0, 0.0, float(coord.x), 3.0);\n  v = imageLoad(g_image_cube, ivec3(coord, g_index[0]));\n  if (v != g_value) r = vec4(1.0, 0.0, float(coord.x), 6.0);\n  v = imageLoad(g_image_2darray, ivec3(coord, g_index[0]));\n  if (v != g_value) r = vec4(1.0, 0.0, float(coord.x), 23.0);\n  o_color[coord.x] = ivec4(r);\n}"
             ,0x1ed);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_2b0._M_dataplus._M_p,
                    CONCAT62(local_2b0.field_2._M_allocated_capacity._2_6_,
                             local_2b0.field_2._M_allocated_capacity._0_2_) + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string GenLoadShader(int stage, GLenum internalformat, const T& expected_value)
	{
		std::ostringstream os;
		os << NL "#define KSIZE 100";
		if (stage == 4)
		{ // CS
			os << NL "layout(local_size_x = KSIZE) in;";
		}
		os << NL "layout(" << FormatEnumToString(internalformat) << ", binding = 3) readonly uniform "
		   << TypePrefix<T>() << "image2D g_image_2d;" NL "layout(" << FormatEnumToString(internalformat)
		   << ", binding = 2) readonly uniform " << TypePrefix<T>() << "image3D g_image_3d;" NL "layout("
		   << FormatEnumToString(internalformat) << ", binding = 1) readonly uniform " << TypePrefix<T>()
		   << "imageCube g_image_cube;" NL "layout(" << FormatEnumToString(internalformat)
		   << ", binding = 0) readonly uniform " << TypePrefix<T>()
		   << "image2DArray g_image_2darray;" NL "layout(std430) buffer out_data {" NL "  ivec4 o_color[KSIZE];" NL
			  "};" NL "void main() {";

		if (stage == 0)
		{ // VS
			os << NL "  " << TypePrefix<T>() << "vec4 g_value = " << TypePrefix<T>() << "vec4(o_color[gl_VertexID]) + "
			   << TypePrefix<T>() << "vec4" << expected_value << ";";
		}
		else if (stage == 4)
		{ // CS
			os << NL "  " << TypePrefix<T>() << "vec4 g_value = " << TypePrefix<T>()
			   << "vec4(o_color[gl_GlobalInvocationID.x]) + " << TypePrefix<T>() << "vec4" << expected_value << ";";
		}

		os << NL "  int g_index[6] = int[](o_color[0].x, o_color[0].y, o_color[0].z, o_color[0].w, o_color[1].r, "
				 "o_color[1].g);";
		if (stage == 0)
		{ // VS
			os << NL "  ivec2 coord = ivec2(gl_VertexID, g_index[0]);";
		}
		else if (stage == 4)
		{ // CS
			os << NL "  ivec2 coord = ivec2(gl_GlobalInvocationID.x, g_index[0]);";
		}
		os << NL "  vec4 r = vec4(0.0, 1.0, 0.0, 1.0);" NL "  " << TypePrefix<T>()
		   << "vec4 v;" NL "  v = imageLoad(g_image_2d, coord);" NL
			  "  if (v != g_value) r = vec4(1.0, 0.0, float(coord.x), 2.0);" NL
			  "  v = imageLoad(g_image_3d, ivec3(coord, g_index[0]));" NL
			  "  if (v != g_value) r = vec4(1.0, 0.0, float(coord.x), 3.0);" NL
			  "  v = imageLoad(g_image_cube, ivec3(coord, g_index[0]));" NL
			  "  if (v != g_value) r = vec4(1.0, 0.0, float(coord.x), 6.0);" NL
			  "  v = imageLoad(g_image_2darray, ivec3(coord, g_index[0]));" NL
			  "  if (v != g_value) r = vec4(1.0, 0.0, float(coord.x), 23.0);" NL "  o_color[coord.x] = ivec4(r);" NL
			  "}";
		return os.str();
	}